

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.hpp
# Opt level: O3

void __thiscall Diligent::StringPool::AssignMemory(StringPool *this,Char *pBuffer,size_t Size)

{
  string msg;
  string local_40;
  
  if (this->m_ReservedSize != 0) {
    FormatString<char[28]>(&local_40,(char (*) [28])"Pool is already initialized");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"AssignMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringPool.hpp"
               ,0x6e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  this->m_ReservedSize = Size;
  this->m_pBuffer = pBuffer;
  this->m_pCurrPtr = pBuffer;
  return;
}

Assistant:

void AssignMemory(Char* pBuffer, size_t Size)
    {
        VERIFY(m_ReservedSize == 0, "Pool is already initialized");
        m_ReservedSize = Size;
        m_pBuffer      = pBuffer;
        m_pCurrPtr     = m_pBuffer;
    }